

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O0

void anon_unknown.dwarf_41187::writeModule(Module *wasm,string *filename,WasmSplitOptions *options)

{
  string local_c8 [48];
  undefined1 local_98 [8];
  ModuleWriter writer;
  WasmSplitOptions *options_local;
  string *filename_local;
  Module *wasm_local;
  
  writer.sourceMapUrl.field_2._8_8_ = options;
  ::wasm::ModuleWriter::ModuleWriter
            ((ModuleWriter *)local_98,&(options->super_ToolOptions).passOptions);
  ::wasm::ModuleWriter::setBinary
            ((ModuleWriter *)local_98,
             (bool)(*(byte *)(writer.sourceMapUrl.field_2._8_8_ + 0x18b) & 1));
  ::wasm::ModuleIOBase::setDebugInfo
            ((ModuleIOBase *)local_98,
             (bool)(*(byte *)(writer.sourceMapUrl.field_2._8_8_ + 0xde) & 1));
  if ((*(byte *)(writer.sourceMapUrl.field_2._8_8_ + 399) & 1) != 0) {
    ::wasm::ModuleWriter::setEmitModuleName((ModuleWriter *)local_98,true);
  }
  std::__cxx11::string::string(local_c8,(string *)filename);
  ::wasm::ModuleWriter::write(local_98,wasm,local_c8);
  std::__cxx11::string::~string(local_c8);
  ::wasm::ModuleWriter::~ModuleWriter((ModuleWriter *)local_98);
  return;
}

Assistant:

void writeModule(Module& wasm,
                 std::string filename,
                 const WasmSplitOptions& options) {
  ModuleWriter writer(options.passOptions);
  writer.setBinary(options.emitBinary);
  writer.setDebugInfo(options.passOptions.debugInfo);
  if (options.emitModuleNames) {
    writer.setEmitModuleName(true);
  }
  writer.write(wasm, filename);
}